

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O3

bool __thiscall S2Polyline::MayIntersect(S2Polyline *this,S2Cell *cell)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  S2Point *pSVar5;
  int iVar6;
  int i;
  long lVar7;
  ulong uVar8;
  S2EdgeCrosser crosser;
  S2Point cell_vertices [4];
  S2EdgeCrosser local_118;
  S2LogMessage local_a8;
  S2Point local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->num_vertices_ != 0) {
    if (0 < this->num_vertices_) {
      iVar6 = 0;
      do {
        pSVar5 = vertex(this,iVar6);
        bVar2 = S2Cell::Contains(cell,pSVar5);
        if (bVar2) {
          return true;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < this->num_vertices_);
    }
    pSVar5 = &local_98;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_98.c_[2] = 0.0;
    uStack_80 = 0;
    local_98.c_[0] = 0.0;
    local_98.c_[1] = 0.0;
    lVar7 = 0;
    do {
      S2Cell::GetVertex((S2Point *)&local_118,cell,(int)lVar7);
      pSVar5->c_[2] = local_118.a_cross_b_.c_[0];
      pSVar5->c_[0] = (VType)local_118.a_;
      pSVar5->c_[1] = (VType)local_118.b_;
      lVar7 = lVar7 + 1;
      pSVar5 = pSVar5 + 1;
    } while (lVar7 != 4);
    bVar2 = true;
    uVar8 = 0;
    do {
      uVar1 = uVar8 + 1;
      pSVar5 = vertex(this,0);
      S2EdgeCrosser::S2EdgeCrosser
                (&local_118,&local_98 + uVar8,&local_98 + ((uint)uVar1 & 3),pSVar5);
      if (1 < this->num_vertices_) {
        iVar6 = 1;
        do {
          pSVar5 = vertex(this,iVar6);
          bVar3 = S2::IsUnitLength(pSVar5);
          if (!bVar3) {
            S2LogMessage::S2LogMessage
                      (&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
                       ,0x108,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_a8.stream_,"Check failed: S2::IsUnitLength(*d) ",0x23);
            abort();
          }
          iVar4 = s2pred::TriageSign(local_118.a_,local_118.b_,pSVar5,&local_118.a_cross_b_);
          if (((iVar4 == 0) || (local_118.acb_ != -iVar4)) &&
             (local_118.bda_ = iVar4, iVar4 = S2EdgeCrosser::CrossingSignInternal(&local_118,pSVar5)
             , pSVar5 = local_118.c_, -1 < iVar4)) {
            return bVar2;
          }
          local_118.c_ = pSVar5;
          iVar6 = iVar6 + 1;
        } while (iVar6 < this->num_vertices_);
      }
      bVar2 = uVar8 < 3;
      uVar8 = uVar1;
    } while (uVar1 != 4);
  }
  return false;
}

Assistant:

bool S2Polyline::MayIntersect(const S2Cell& cell) const {
  if (num_vertices() == 0) return false;

  // We only need to check whether the cell contains vertex 0 for correctness,
  // but these tests are cheap compared to edge crossings so we might as well
  // check all the vertices.
  for (int i = 0; i < num_vertices(); ++i) {
    if (cell.Contains(vertex(i))) return true;
  }
  S2Point cell_vertices[4];
  for (int i = 0; i < 4; ++i) {
    cell_vertices[i] = cell.GetVertex(i);
  }
  for (int j = 0; j < 4; ++j) {
    S2EdgeCrosser crosser(&cell_vertices[j], &cell_vertices[(j+1)&3],
                                    &vertex(0));
    for (int i = 1; i < num_vertices(); ++i) {
      if (crosser.CrossingSign(&vertex(i)) >= 0) {
        // There is a proper crossing, or two vertices were the same.
        return true;
      }
    }
  }
  return false;
}